

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O2

void TestEncoderVelocity(BasePort *port,AmpIO *board,MotionTrajectory *motion)

{
  pointer ppMVar1;
  undefined4 uVar2;
  bool bVar3;
  uint uVar4;
  int32_t iVar5;
  uint32_t uVar6;
  ostream *poVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  char *pcVar14;
  pointer pEVar15;
  undefined8 *puVar16;
  EncData *pEVar17;
  pointer ppVar18;
  pointer ppVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  byte bVar24;
  double dt;
  double dVar25;
  double local_1318;
  vector<EncData,_std::allocator<EncData>_> measuredData;
  double local_12e0;
  EncData encData;
  double raccel;
  double rvel;
  double rpos;
  double vel;
  double accel;
  double pos;
  ofstream outFile;
  quadlet_t waveform [1024];
  
  bVar24 = 0;
  (*(board->super_FpgaIO).super_BoardIO._vptr_BoardIO[10])(board);
  uVar4 = MotionTrajectory::CreateWaveform(motion,waveform,0x400,dt,1,1);
  poVar7 = std::operator<<((ostream *)&std::cout,"Writing waveform table with ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  poVar7 = std::operator<<(poVar7," entries");
  std::endl<char,std::char_traits<char>>(poVar7);
  bVar3 = AmpIO::WriteWaveformTable(board,waveform,0,(unsigned_short)uVar4);
  if (bVar3) {
    bVar3 = MotionTrajectory::GetValuesAtTime(motion,0.0,&pos,&vel,&accel);
    if (bVar3) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Initializing encoders (about 6 seconds)");
      std::endl<char,std::char_traits<char>>(poVar7);
      bVar3 = vel < 0.0;
      AmpIO::WriteDigitalOutput(board,'\x03',!bVar3 * '\x02');
      Amp1394_Sleep(1.4);
      AmpIO::WriteDigitalOutput(board,'\x03',bVar3 * '\x02');
      Amp1394_Sleep(1.4);
      AmpIO::WriteDigitalOutput(board,'\x03',bVar3 * '\x02' + '\x01');
      Amp1394_Sleep(1.4);
      AmpIO::WriteDigitalOutput(board,'\x03',!bVar3 * '\x02' + '\x01');
      Amp1394_Sleep(1.4);
      for (uVar4 = 0; uVar4 != 4; uVar4 = uVar4 + 1) {
        AmpIO::WriteEncoderPreload(board,uVar4,0);
      }
      Amp1394_Sleep(0.05);
      (*port->_vptr_BasePort[0x1d])();
      iVar5 = AmpIO::GetEncoderPosition(board,0);
      for (uVar4 = 0; (iVar5 != 0 && (uVar4 < 5)); uVar4 = uVar4 + 1) {
        poVar7 = std::operator<<((ostream *)&std::cout,"WriteEncoderPreload: retrying (pos = ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
        poVar7 = std::operator<<(poVar7,")");
        std::endl<char,std::char_traits<char>>(poVar7);
        AmpIO::WriteEncoderPreload(board,0,0);
        Amp1394_Sleep(0.05);
        (*port->_vptr_BasePort[0x1d])();
        iVar5 = AmpIO::GetEncoderPosition(board,0);
      }
      if (iVar5 == 0) {
        poVar7 = std::operator<<((ostream *)&std::cout,"Starting position = ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
        std::operator<<(poVar7,", velocity = ");
        dVar25 = AmpIO::GetEncoderVelocity(board,0);
        poVar7 = std::ostream::_M_insert<double>(dVar25);
        std::operator<<(poVar7,", acceleration = ");
        dVar25 = AmpIO::GetEncoderAcceleration(board,0,1.0);
        poVar7 = std::ostream::_M_insert<double>(dVar25);
        std::endl<char,std::char_traits<char>>(poVar7);
        poVar7 = std::operator<<((ostream *)&std::cout,"Running test");
        std::endl<char,std::char_traits<char>>(poVar7);
        measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ppMVar1 = (motion->motionList).
                  super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppMVar1 ==
            (motion->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          dVar25 = 0.0;
        }
        else {
          dVar25 = ppMVar1[-1]->tf;
        }
        uVar8 = (ulong)(dVar25 / 0.0005);
        std::vector<EncData,_std::allocator<EncData>_>::reserve
                  (&measuredData,
                   (long)(dVar25 / 0.0005 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8);
        EncoderVelocity::Init(&encData.encVelData.super_EncoderVelocity);
        encData.mpos = 0;
        AmpIO::WriteWaveformControl(board,'\x03','\x03');
        uVar4 = 0x116601;
        while (((uVar4 & 1) != 0 || (encData.mpos == 0))) {
          (*port->_vptr_BasePort[0x1d])();
          uVar6 = AmpIO::GetDigitalInput(board);
          if ((uVar6 & 0x20000000) != 0) {
            encData.mpos = AmpIO::GetEncoderPosition(board,0);
            encData.mvel = AmpIO::GetEncoderVelocity(board,0);
            encData.mvelpred = AmpIO::GetEncoderVelocityPredicted(board,0,1.0);
            encData.maccel = AmpIO::GetEncoderAcceleration(board,0,1.0);
            encData.run = AmpIO::GetEncoderRunningCounterSeconds(board,0);
            encData.ts = AmpIO::GetTimestampSeconds(board);
            bVar3 = AmpIO::GetEncoderVelocityData(board,0,&encData.encVelData.super_EncoderVelocity)
            ;
            if (!bVar3) {
              poVar7 = std::operator<<((ostream *)&std::cout,"GetEncoderVelocityData failed");
              std::endl<char,std::char_traits<char>>(poVar7);
            }
            std::vector<EncData,_std::allocator<EncData>_>::push_back(&measuredData,&encData);
          }
          uVar4 = (uVar6 & 0x20000000) >> 0x1d;
          Amp1394_Sleep(0.0005);
        }
        poVar7 = std::operator<<((ostream *)&std::cout,"Read ");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        poVar7 = std::operator<<(poVar7," samples");
        std::endl<char,std::char_traits<char>>(poVar7);
        ppVar18 = (motion->encList).
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar19 = (motion->encList).
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        uVar4 = 0;
        iVar20 = 0;
        if (ppVar19 != ppVar18) {
          iVar20 = ppVar18->second;
        }
        uVar8 = 1;
        local_1318 = 0.0;
        local_12e0 = 0.0;
        uVar11 = 0;
        do {
          lVar9 = 0xd;
          if ((ulong)(((long)measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x68) <= uVar11) {
            local_1318 = 0.0;
            if (uVar4 != 0) {
              local_1318 = local_12e0 / (double)uVar4;
            }
            std::operator<<((ostream *)&std::cout,"Time offset = ");
            poVar7 = std::ostream::_M_insert<double>(local_1318);
            poVar7 = std::operator<<(poVar7," (");
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            poVar7 = std::operator<<(poVar7," samples)");
            std::endl<char,std::char_traits<char>>(poVar7);
            std::ofstream::ofstream(&outFile,"waveform.csv",_S_trunc);
            poVar7 = std::operator<<((ostream *)&outFile,
                                     "time, mpos, mvel, mvelpred, maccel, run, rpos, rvel, raccel, ts, velper, qtr1, qtr5, flags"
                                    );
            std::endl<char,std::char_traits<char>>(poVar7);
            local_1318 = -local_1318;
            lVar9 = 0;
            for (uVar8 = 0;
                uVar8 < (ulong)(((long)measuredData.
                                       super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl
                                       .super__Vector_impl_data._M_finish -
                                (long)measuredData.
                                      super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                                      super__Vector_impl_data._M_start) / 0x68); uVar8 = uVar8 + 1)
            {
              puVar16 = (undefined8 *)
                        ((long)&(measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->mpos + lVar9);
              pEVar17 = &encData;
              for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
                *(undefined8 *)pEVar17 = *puVar16;
                puVar16 = puVar16 + (ulong)bVar24 * -2 + 1;
                pEVar17 = (EncData *)((long)pEVar17 + (ulong)bVar24 * -0x10 + 8);
              }
              local_1318 = local_1318 + encData.ts;
              bVar3 = MotionTrajectory::GetValuesAtTime(motion,local_1318,&rpos,&rvel,&raccel);
              if (bVar3) {
                poVar7 = std::ostream::_M_insert<double>(local_1318);
                poVar7 = std::operator<<(poVar7,", ");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,encData.mpos);
                std::operator<<(poVar7,", ");
                poVar7 = std::ostream::_M_insert<double>(encData.mvel);
                std::operator<<(poVar7,", ");
                poVar7 = std::ostream::_M_insert<double>(encData.mvelpred);
                std::operator<<(poVar7,", ");
                poVar7 = std::ostream::_M_insert<double>(encData.maccel);
                std::operator<<(poVar7,", ");
                poVar7 = std::ostream::_M_insert<double>(encData.run);
                std::operator<<(poVar7,", ");
                poVar7 = std::ostream::_M_insert<double>(rpos);
                std::operator<<(poVar7,", ");
                poVar7 = std::ostream::_M_insert<double>(rvel);
                std::operator<<(poVar7,", ");
                poVar7 = std::ostream::_M_insert<double>(raccel);
                std::operator<<(poVar7,", ");
                poVar7 = std::ostream::_M_insert<double>(encData.ts);
                poVar7 = std::operator<<(poVar7,", ");
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                poVar7 = std::operator<<(poVar7,", ");
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                poVar7 = std::operator<<(poVar7,", ");
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                std::operator<<(poVar7,", ");
                EncoderVelocityLocal::PrintFlags(&encData.encVelData,&outFile);
                poVar7 = (ostream *)&outFile;
              }
              else {
                std::operator<<((ostream *)&std::cout,"GetValuesAtTime failed for time = ");
                poVar7 = std::ostream::_M_insert<double>(local_1318);
              }
              std::endl<char,std::char_traits<char>>(poVar7);
              lVar9 = lVar9 + 0x68;
            }
            std::ofstream::~ofstream(&outFile);
            std::_Vector_base<EncData,_std::allocator<EncData>_>::~_Vector_base
                      (&measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>);
            return;
          }
          pEVar15 = measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar11;
          pEVar17 = &encData;
          for (; lVar9 != 0; lVar9 = lVar9 + -1) {
            uVar2 = *(undefined4 *)&pEVar15->field_0x4;
            pEVar17->mpos = pEVar15->mpos;
            *(undefined4 *)&pEVar17->field_0x4 = uVar2;
            pEVar15 = (pointer)((long)pEVar15 + (ulong)bVar24 * -0x10 + 8);
            pEVar17 = (EncData *)((long)pEVar17 + (ulong)bVar24 * -0x10 + 8);
          }
          local_1318 = local_1318 + encData.ts;
          if (encData.mpos != iVar20) {
            if (uVar8 < (ulong)((long)ppVar19 - (long)ppVar18 >> 4)) {
              iVar20 = ppVar18[uVar8].second;
              if (encData.mpos != iVar20) {
LAB_00107206:
                poVar7 = std::operator<<((ostream *)&std::cout,"Unexpected encoder position: ");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,encData.mpos);
                poVar7 = std::operator<<(poVar7,", expecting ");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar20);
                poVar7 = std::operator<<(poVar7," (index = ");
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                poVar7 = std::operator<<(poVar7,")");
                std::endl<char,std::char_traits<char>>(poVar7);
                uVar21 = iVar20 - encData.mpos;
                uVar12 = -uVar21;
                if (0 < (int)uVar21) {
                  uVar12 = uVar21;
                }
                ppVar18 = (motion->encList).
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                ppVar19 = (motion->encList).
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                dVar25 = 0.0;
                uVar21 = uVar12;
                do {
                  uVar23 = uVar8 << 4 | 8;
                  uVar22 = uVar8;
                  uVar13 = uVar12;
                  uVar12 = uVar21;
                  while( true ) {
                    if ((((ulong)((long)ppVar19 - (long)ppVar18 >> 4) <= uVar22) || (uVar12 == 0))
                       || (uVar13 < uVar12)) goto LAB_0010734d;
                    iVar20 = *(int *)((long)&ppVar18->first + uVar23);
                    uVar13 = iVar20 - encData.mpos;
                    uVar21 = -uVar13;
                    if (0 < (int)uVar13) {
                      uVar21 = uVar13;
                    }
                    if (iVar20 == encData.mpos) break;
                    uVar22 = uVar22 + 1;
                    uVar23 = uVar23 + 0x10;
                    uVar13 = uVar12;
                    uVar12 = uVar21;
                  }
                  poVar7 = std::operator<<((ostream *)&std::cout,"Found match at index ");
                  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                  std::endl<char,std::char_traits<char>>(poVar7);
                  ppVar18 = (motion->encList).
                            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  ppVar19 = (motion->encList).
                            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  dVar25 = -1.0;
                  if (uVar22 < (ulong)((long)ppVar19 - (long)ppVar18 >> 4)) {
                    dVar25 = *(double *)((long)ppVar18 + (uVar23 - 8));
                  }
                  uVar8 = uVar22 + 1;
                } while( true );
              }
              dVar25 = ppVar18[uVar8].first;
            }
            else {
              iVar20 = 0;
              dVar25 = -1.0;
              if (encData.mpos != 0) goto LAB_00107206;
            }
            uVar8 = uVar8 + 1;
LAB_0010734d:
            iVar20 = encData.mpos;
            if (((0.0 < dVar25) && (encData.encVelData.super_EncoderVelocity.runOverflow == false))
               && (uVar8 < 10)) {
              local_12e0 = local_12e0 + (local_1318 - (dVar25 + encData.run));
              uVar4 = uVar4 + 1;
            }
          }
          uVar11 = uVar11 + 1;
        } while( true );
      }
      pcVar14 = "Failed to preload encoder";
    }
    else {
      pcVar14 = "TestEncoderVelocity: failed to get initial values";
    }
  }
  else {
    pcVar14 = "WriteWaveformTable failed";
  }
  poVar7 = std::operator<<((ostream *)&std::cout,pcVar14);
  std::endl<char,std::char_traits<char>>(poVar7);
  return;
}

Assistant:

void TestEncoderVelocity(BasePort *port, AmpIO *board, MotionTrajectory &motion)
{
    const int WLEN = 1024;
    const int testAxis = 0;   // All axes should be the same when using test board
    quadlet_t waveform[WLEN];
    double dt = board->GetFPGAClockPeriod();

    unsigned int numEntries = motion.CreateWaveform(waveform, WLEN, dt);

    std::cout << "Writing waveform table with " << numEntries << " entries" << std::endl;
    if (!board->WriteWaveformTable(waveform, 0, numEntries)) {
        std::cout << "WriteWaveformTable failed" << std::endl;
        return;
    }

    double pos, vel, accel;
    if (!motion.GetValuesAtTime(0.0, pos, vel, accel)) {
        std::cout << "TestEncoderVelocity: failed to get initial values" << std::endl;
        return;
    }
    std::cout << "Initializing encoders (about 6 seconds)" << std::endl;
    // Initial movements to initialize firmware
    // Wait long enough for encoder period to overflow
    if (vel >= 0) {
        board->WriteDigitalOutput(0x03, 0x02);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x00);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x01);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x03);
        Amp1394_Sleep(1.4);
    }
    else {
        board->WriteDigitalOutput(0x03, 0x00);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x02);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x03);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x01);
        Amp1394_Sleep(1.4);
    }

    // Initialize encoder position
    unsigned int i;
    for (i = 0; i < 4; i++)
        board->WriteEncoderPreload(i, 0);

    Amp1394_Sleep(0.05);
    port->ReadAllBoards();
    int startPos = board->GetEncoderPosition(testAxis);
    // Sometimes, position is non-zero after preload
    for (i = 0; (i < 5) && (startPos != 0); i++) {
        std::cout << "WriteEncoderPreload: retrying (pos = " << startPos << ")" << std::endl;
        board->WriteEncoderPreload(testAxis, 0);
        Amp1394_Sleep(0.05);
        port->ReadAllBoards();
        startPos = board->GetEncoderPosition(testAxis);
    }
    if (startPos != 0) {
        std::cout << "Failed to preload encoder" << std::endl;
        return;
    }
    std::cout << "Starting position = " << startPos
              << ", velocity = " << board->GetEncoderVelocity(testAxis)
              << ", acceleration = " << board->GetEncoderAcceleration(testAxis) << std::endl;
    std::cout << "Running test" << std::endl;

    std::vector<EncData> measuredData;
    // Estimate data size
    const double loopTime = 0.0005;  // Loop time in seconds (~2 kHz)
    double tf, pf, vf, af;
    motion.GetFinalValues(tf, pf, vf, af);
    // Overestimates datasize because the actual loop time will be less than loopTime.
    size_t dataSize = static_cast<size_t>(tf/loopTime);
    measuredData.reserve(dataSize);

    EncData encData;
    encData.mpos = 0;
    bool waveform_active = true;

    // Start waveform on DOUT1 and DOUT2 (to produce EncA and EncB using test board)
    board->WriteWaveformControl(0x03, 0x03);

    // Collect the data, storing it in measuredData
    while (waveform_active || (encData.mpos == 0)) {
        port->ReadAllBoards();
        waveform_active = board->GetDigitalInput()&0x20000000;
        if (waveform_active) {
            encData.mpos = board->GetEncoderPosition(testAxis);
            encData.mvel = board->GetEncoderVelocity(testAxis);
            encData.mvelpred = board->GetEncoderVelocityPredicted(testAxis);
            encData.maccel = board->GetEncoderAcceleration(testAxis);
            encData.run = board->GetEncoderRunningCounterSeconds(testAxis);
            encData.ts = board->GetTimestampSeconds();
            if (!board->GetEncoderVelocityData(testAxis, encData.encVelData))
                std::cout << "GetEncoderVelocityData failed" << std::endl;
            measuredData.push_back(encData);
        }
        Amp1394_Sleep(loopTime);
    }
    std::cout << "Read " << measuredData.size() << " samples" << std::endl;

    // Synchronize time
    // Time as measured by FPGA (accumulated timestamp values)
    double clkTime = 0.0;

    // Reference encoder position
    int epos = motion.GetEncoderEventPosition(0);
    size_t curIndex = 1;

    // For computing mean time difference
    double sumDiff = 0.0;
    unsigned int numDiff = 0;

    size_t dataIndex;
    for (dataIndex = 0; dataIndex < measuredData.size(); dataIndex++) {
        encData = measuredData[dataIndex];
        clkTime += encData.ts;
        // Find mpos in encoder list
        if (encData.mpos != epos) {
            double rtime = 0.0;
            epos = motion.GetEncoderEventPosition(curIndex);
            if (encData.mpos == epos) {
                rtime = motion.GetEncoderEventTime(curIndex);
                curIndex++;
            }
            else {
                std::cout << "Unexpected encoder position: " << encData.mpos << ", expecting " << epos
                          << " (index = " << curIndex << ")" << std::endl;
                size_t testIndex;
                int testPos = epos;
                unsigned int lastDiff = abs(epos-encData.mpos);
                unsigned int curDiff = lastDiff;
                for (testIndex = curIndex; (testIndex < motion.GetNumEncoderEvents()) && (curDiff != 0)
                         && (curDiff <= lastDiff) ; testIndex++) {
                    testPos = motion.GetEncoderEventPosition(testIndex);
                    lastDiff = curDiff;
                    curDiff = abs(testPos-encData.mpos);
                    if (curDiff == 0) {
                        std::cout << "Found match at index " << testIndex << std::endl;
                        rtime = motion.GetEncoderEventTime(testIndex);
                        curIndex = testIndex+1;
                    }
                }
                epos = encData.mpos;
            }
            // For now, consider first few encoder transitions when computing time difference
            if ((rtime > 0.0) && (!encData.encVelData.IsRunningCounterOverflow()) && (curIndex < 10)) {
                double timeDiff = clkTime-(rtime+encData.run);
                sumDiff += timeDiff;
                numDiff++;
            }
            epos = encData.mpos;
        }
    }
    double tOffset = 0.0;
    if (numDiff > 0)
        tOffset = sumDiff/numDiff;
    std::cout << "Time offset = " << tOffset << " (" << numDiff << " samples)" << std::endl;

    // Output data to file
    std::ofstream outFile("waveform.csv", std::ios_base::trunc);
    outFile << "time, mpos, mvel, mvelpred, maccel, run, rpos, rvel, raccel, ts, velper, qtr1, qtr5, flags" << std::endl;

    clkTime = -tOffset;
    for (dataIndex = 0; dataIndex < measuredData.size(); dataIndex++) {
        encData = measuredData[dataIndex];
        clkTime += encData.ts;
        double rpos, rvel, raccel;
        if (motion.GetValuesAtTime(clkTime, rpos, rvel, raccel)) {
            outFile << clkTime << ", " << encData.mpos << ", " << encData.mvel << ", " << encData.mvelpred << ", " << encData.maccel << ", "
                    << encData.run << ", " << rpos << ", " << rvel << ", " << raccel << ", " << encData.ts << ", "
                    << encData.encVelData.GetEncoderVelocityPeriod() << ", "
                    << encData.encVelData.GetEncoderQuarter1Period() << ", "
                    << encData.encVelData.GetEncoderQuarter5Period() << ", ";
            encData.encVelData.PrintFlags(outFile);
            outFile << std::endl;
        }
        else
            std::cout << "GetValuesAtTime failed for time = " << clkTime << std::endl;
    }
}